

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O3

HANDLE CreateSemaphoreExA(LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,LONG lInitialCount,
                         LONG lMaximumCount,LPCSTR lpName,DWORD dwFlags,DWORD dwDesiredAccess)

{
  HANDLE pVVar1;
  
  if (dwDesiredAccess != 0x1f0003) {
    fprintf(_stderr,"] %s %s:%d","CreateSemaphoreExA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x57);
    fprintf(_stderr,"Expression: SEMAPHORE_ALL_ACCESS == dwDesiredAccess\n");
  }
  pVVar1 = CreateSemaphoreA(lpSemaphoreAttributes,lInitialCount,lMaximumCount,lpName);
  return pVVar1;
}

Assistant:

HANDLE
PALAPI
CreateSemaphoreExA(
        IN LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,
        IN LONG lInitialCount,
        IN LONG lMaximumCount,
        IN LPCSTR lpName,
        IN /*_Reserved_*/  DWORD dwFlags,
        IN DWORD dwDesiredAccess)
{
    // dwFlags is reserved and unused, and dwDesiredAccess is currently
    // only ever used as SEMAPHORE_ALL_ACCESS.  The other parameters
    // all map to CreateSemaphoreA.
    _ASSERTE(SEMAPHORE_ALL_ACCESS == dwDesiredAccess);

    return CreateSemaphoreA(
        lpSemaphoreAttributes,
        lInitialCount,
        lMaximumCount,
        lpName);
}